

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::__encodeArray
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  byte bVar3;
  SimplePFor<FastPForLib::Simple8b<true>_> *pSVar4;
  uint32_t *puVar5;
  ulong uVar6;
  uint bit;
  uint32_t k;
  long lVar7;
  byte *__src;
  uint32_t *puVar8;
  ulong uVar9;
  uint uVar10;
  byte *pbVar11;
  ulong __n;
  uint8_t bestb;
  uint8_t bestcexcept;
  uint8_t maxb;
  size_t outcap;
  byte local_73;
  byte local_72;
  uint8_t local_71;
  uint32_t *local_70;
  uint local_64;
  size_t *local_60;
  uint32_t *local_58;
  SimplePFor<FastPForLib::Simple8b<true>_> *local_50;
  uint32_t *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  size_t local_38;
  
  local_70 = out;
  local_60 = nvalue;
  checkifdivisibleby(length,0x80);
  puVar2 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar2) {
    (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  __src = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
  puVar8 = local_70 + 1;
  pbVar11 = __src;
  if (0x7f < (long)length) {
    local_40 = &this->datatobepacked;
    local_58 = in + length;
    puVar5 = in + 0x80;
    local_50 = this;
    do {
      pSVar4 = local_50;
      local_48 = puVar5;
      getBestBFromData(local_50,in,&local_73,&local_72,&local_71);
      bVar3 = local_73;
      *pbVar11 = local_73;
      pbVar11[1] = local_72;
      pbVar11 = pbVar11 + 2;
      if (local_72 != 0) {
        lVar7 = 0;
        do {
          if (in[lVar7] >> (bVar3 & 0x1f) != 0) {
            local_64 = in[lVar7] >> (local_73 & 0x1f);
            __position._M_current =
                 (pSVar4->datatobepacked).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pSVar4->datatobepacked).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_40,__position,&local_64);
            }
            else {
              *__position._M_current = local_64;
              (pSVar4->datatobepacked).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            *pbVar11 = (byte)lVar7;
            pbVar11 = pbVar11 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x80);
      }
      bit = (uint)local_73;
      lVar7 = 0;
      uVar10 = (uint)local_73;
      do {
        fastpack((uint32_t *)((long)in + lVar7),puVar8,bit);
        lVar7 = lVar7 + 0x80;
        puVar8 = (uint32_t *)((long)puVar8 + (ulong)(uVar10 * 4));
      } while (lVar7 != 0x200);
      in = in + 0x80;
      puVar5 = local_48 + 0x80;
    } while (puVar5 <= local_58);
    __src = (local_50->bytescontainer).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    this = local_50;
  }
  puVar5 = puVar8 + 1;
  uVar10 = (int)pbVar11 - (int)__src;
  *local_70 = (uint32_t)((ulong)((long)puVar8 - (long)local_70) >> 2);
  *puVar8 = uVar10;
  __n = (ulong)uVar10;
  memcpy(puVar5,__src,__n);
  uVar9 = __n + 3 & 0xfffffffffffffffc;
  if (__n < uVar9) {
    uVar1 = __n + 5 + (long)puVar8;
    uVar6 = uVar9 + 4 + (long)puVar8;
    if (uVar6 < uVar1) {
      uVar6 = uVar1;
    }
    memset((void *)((long)puVar5 + __n),0,(uVar6 - (__n + (long)puVar8)) - 4);
  }
  local_38 = 0;
  puVar8 = (this->datatobepacked).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Simple8b<true>::encodeArray
            (&this->ecoder,puVar8,
             (long)(this->datatobepacked).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar8 >> 2,
             (uint32_t *)((long)puVar5 + uVar9),&local_38);
  *local_60 = (long)((long)((long)puVar5 + uVar9) + (local_38 * 4 - (long)local_70)) >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    datatobepacked.clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        assert(bestb < 32);
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            datatobepacked.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    size_t outcap = 0;
    ecoder.encodeArray(datatobepacked.data(), datatobepacked.size(), out,
                       outcap);
    out += outcap;
    nvalue = out - initout;
  }